

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::ComplainAboutBadComponent
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg,int c,bool strong)

{
  int iVar1;
  pointer pcVar2;
  int *piVar3;
  cmGeneratorTarget *pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  TargetType targetType;
  string *psVar7;
  ostream *poVar8;
  long lVar9;
  cmGraphEdge *ni;
  pointer pcVar10;
  char *pcVar11;
  int *piVar12;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"The inter-target dependency graph contains the following ",0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"strongly connected component (cycle):\n",0x26);
  pcVar2 = (ccg->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar3 = *(pointer *)
            ((long)&pcVar2[c].super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  for (piVar12 = *(int **)&pcVar2[c].super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl; piVar12 != piVar3;
      piVar12 = piVar12 + 1) {
    iVar1 = *piVar12;
    pcVar4 = (this->Targets).
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar1];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  \"",3);
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar4);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" of type ",10);
    targetType = cmGeneratorTarget::GetType(pcVar4);
    psVar7 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    pcVar5 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar6 = *(pointer *)
              ((long)&pcVar5[iVar1].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
    for (pcVar10 = *(pointer *)
                    &pcVar5[iVar1].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                     super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        pcVar10 != pcVar6; pcVar10 = pcVar10 + 1) {
      if ((ccg->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[pcVar10->Dest] == c) {
        pcVar4 = (this->Targets).
                 super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[pcVar10->Dest];
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    depends on \"",0x10);
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar4);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," (",2);
        pcVar11 = "weak";
        if (pcVar10->Strong != false) {
          pcVar11 = "strong";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,pcVar11,(ulong)pcVar10->Strong * 2 + 4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,")\n",2);
      }
    }
  }
  if (strong) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "The component contains at least one cycle consisting of strong ",0x3f);
    lVar9 = 0x41;
    pcVar11 = "dependencies (created by add_dependencies) that cannot be broken.";
  }
  else if (this->NoCycles == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The GLOBAL_DEPENDS_NO_CYCLES global property is enabled, so ",
               0x3c);
    lVar9 = 0x40;
    pcVar11 = "cyclic dependencies are not allowed even among static libraries.";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"At least one of these targets is not a STATIC_LIBRARY.  ",0x38)
    ;
    lVar9 = 0x3c;
    pcVar11 = "Cyclic dependencies are allowed only among static libraries.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,lVar9);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void cmComputeTargetDepends::ComplainAboutBadComponent(
  cmComputeComponentGraph const& ccg, int c, bool strong)
{
  // Construct the error message.
  std::ostringstream e;
  e << "The inter-target dependency graph contains the following "
    << "strongly connected component (cycle):\n";
  std::vector<NodeList> const& components = ccg.GetComponents();
  std::vector<int> const& cmap = ccg.GetComponentMap();
  NodeList const& cl = components[c];
  for (int i : cl) {
    // Get the depender.
    cmGeneratorTarget const* depender = this->Targets[i];

    // Describe the depender.
    e << "  \"" << depender->GetName() << "\" of type "
      << cmState::GetTargetTypeName(depender->GetType()) << "\n";

    // List its dependencies that are inside the component.
    EdgeList const& nl = this->InitialGraph[i];
    for (cmGraphEdge const& ni : nl) {
      int j = ni;
      if (cmap[j] == c) {
        cmGeneratorTarget const* dependee = this->Targets[j];
        e << "    depends on \"" << dependee->GetName() << "\""
          << " (" << (ni.IsStrong() ? "strong" : "weak") << ")\n";
      }
    }
  }
  if (strong) {
    // Custom command executable dependencies cannot occur within a
    // component of static libraries.  The cycle must appear in calls
    // to add_dependencies.
    e << "The component contains at least one cycle consisting of strong "
      << "dependencies (created by add_dependencies) that cannot be broken.";
  } else if (this->NoCycles) {
    e << "The GLOBAL_DEPENDS_NO_CYCLES global property is enabled, so "
      << "cyclic dependencies are not allowed even among static libraries.";
  } else {
    e << "At least one of these targets is not a STATIC_LIBRARY.  "
      << "Cyclic dependencies are allowed only among static libraries.";
  }
  cmSystemTools::Error(e.str());
}